

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O3

void __thiscall expr_tree::divSimplifs(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  bool bVar2;
  expr_node *peVar3;
  expr_node *tmp;
  
  bVar2 = IsZero(node->left);
  if (bVar2) {
    peVar1 = node->left;
    if (peVar1 != (expr_node *)0x0) {
      expr_node::~expr_node(peVar1);
    }
    operator_delete(peVar1,0x28);
    peVar1 = node->right;
    if (peVar1 != (expr_node *)0x0) {
      expr_node::~expr_node(peVar1);
    }
    operator_delete(peVar1,0x28);
    node->left = (expr_node *)0x0;
    node->right = (expr_node *)0x0;
    node->type = '\x01';
    (node->value).integer = 0;
    return;
  }
  bVar2 = IsOne(node->right);
  peVar1 = node->left;
  if (bVar2) {
    peVar3 = node->right;
    if (peVar3 != (expr_node *)0x0) {
      expr_node::~expr_node(peVar3);
    }
    operator_delete(peVar3,0x28);
    node->type = peVar1->type;
    node->value = peVar1->value;
    Link(node,peVar1->left,peVar1->right);
    peVar1->left = (expr_node *)0x0;
    peVar1->right = (expr_node *)0x0;
    expr_node::~expr_node(peVar1);
    node = peVar1;
  }
  else {
    bVar2 = IsOne(peVar1);
    if (!bVar2) {
      return;
    }
    peVar1 = node->parent;
    if (peVar1 == (expr_node *)0x0) {
      return;
    }
    if (peVar1->type != '\x05') {
      return;
    }
    if ((peVar1->value).integer != 3) {
      return;
    }
    bVar2 = IsOnLeft(node);
    (node->parent->value).integer = 4;
    peVar1 = node->parent;
    if (bVar2) {
      peVar3 = peVar1->right;
    }
    else {
      peVar3 = peVar1->left;
    }
    Link(peVar1,peVar3,node->right);
    node->right = (expr_node *)0x0;
    expr_node::~expr_node(node);
  }
  operator_delete(node,0x28);
  return;
}

Assistant:

void expr_tree::divSimplifs(expr_node* node)
{
    if (IsZero(node->left)) {
        delete node->left;
        delete node->right;
        node->left = node->right = nullptr;
        node->type = INT;
        node->value.integer = 0;
    } else if (IsOne(node->right)) {
        expr_node* tmp = node->left;
        delete node->right;
        node->type = tmp->type;
        node->value = tmp->value;
        Link(node, tmp->left, tmp->right);
        tmp->left = tmp->right = nullptr;
        delete tmp;
    } else if (IsOne(node->left) && node->parent != nullptr && node->parent->type == OP && node->parent->value.integer == MUL) {
        if (IsOnLeft(node)) {
            node->parent->value.integer = DIV;
            Link(node->parent, node->parent->right, node->right);
            node->right = nullptr;
            delete node;
        } else {
            node->parent->value.integer = DIV;
            Link(node->parent, node->parent->left, node->right);
            node->right = nullptr;
            delete node;
        }
    }
}